

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_stringsegment.cpp
# Opt level: O2

bool __thiscall
icu_63::numparse::impl::StringSegment::operator==(StringSegment *this,UnicodeString *other)

{
  UBool UVar1;
  UnicodeString local_50;
  
  toTempUnicodeString(&local_50,this);
  UVar1 = UnicodeString::operator==(&local_50,other);
  UnicodeString::~UnicodeString(&local_50);
  return UVar1 != '\0';
}

Assistant:

bool StringSegment::operator==(const UnicodeString& other) const {
    return toTempUnicodeString() == other;
}